

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale_p.h
# Opt level: O0

bool __thiscall QLocaleId::acceptScriptTerritory(QLocaleId *this,QLocaleId other)

{
  bool local_1a;
  bool local_19;
  QLocaleId *this_local;
  QLocaleId other_local;
  
  if ((this->territory_id == 0) || (local_19 = false, other.territory_id == this->territory_id)) {
    local_1a = true;
    if (this->script_id != 0) {
      other_local.script_id = other.script_id;
      local_1a = other_local.script_id == this->script_id;
    }
    local_19 = local_1a;
  }
  return local_19;
}

Assistant:

[[nodiscard]] inline bool acceptScriptTerritory(QLocaleId other) const noexcept
    {
        return (!territory_id || other.territory_id == territory_id)
                && (!script_id || other.script_id == script_id);
    }